

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O1

TestStatus *
vkt::wsi::anon_unknown_0::querySurfaceSupportTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  ostringstream *this;
  Vector<unsigned_int,_2> *log;
  Window *pWVar1;
  Display *pDVar2;
  TestStatus *pTVar3;
  VkBool32 VVar4;
  qpTestResult qVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  NativeObjects native;
  ResultCollector results;
  InstanceHelper instHelper;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_440;
  VkSurfaceKHR local_428;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_420;
  uint local_418 [2];
  VkAllocationCallbacks *pVStack_410;
  Window *local_408;
  Display *local_400;
  TestStatus *local_3f8;
  Vector<unsigned_int,_2> *local_3f0;
  ulong local_3e8;
  VkPhysicalDevice local_3e0;
  NativeObjects local_3d8;
  ResultCollector local_3b8;
  undefined1 local_368 [16];
  Vector<unsigned_int,_2> local_358;
  VkAllocationCallbacks *pVStack_350;
  ios_base local_2f0 [264];
  undefined1 local_1e8 [32];
  DestroyInstanceFunc p_Stack_1c8;
  VkAllocationCallbacks *local_1c0;
  InstanceDriver local_1b8;
  
  log = (Vector<unsigned_int,_2> *)context->m_testCtx->m_log;
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  tcu::ResultCollector::ResultCollector(&local_3b8,(TestLog *)log,(string *)local_1e8);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)local_1e8,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_368._0_8_ = (Vector<unsigned_int,_2> *)0x0;
  NativeObjects::NativeObjects
            (&local_3d8,context,(Extensions *)local_1e8,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)local_368);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_368,&local_1b8.super_InstanceInterface,
             (VkInstance)local_1e8._24_8_,wsiType,
             local_3d8.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_3d8.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  local_408 = local_3d8.window.
              super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr;
  local_400 = local_3d8.display.
              super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr;
  local_418[0] = local_358.m_data[0];
  local_418[1] = local_358.m_data[1];
  pVStack_410 = pVStack_350;
  local_428.m_internal = local_368._0_8_;
  aStack_420.m_align = local_368._8_8_;
  local_3f8 = __return_storage_ptr__;
  local_3f0 = log;
  ::vk::enumeratePhysicalDevices
            (&local_440,&local_1b8.super_InstanceInterface,(VkInstance)local_1e8._24_8_);
  if (local_440.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_440.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this = (ostringstream *)(local_368 + 8);
    uVar8 = 0;
    do {
      local_3e0 = local_440.
                  super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8];
      local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
      (*local_1b8.super_InstanceInterface._vptr_InstanceInterface[6])
                (&local_1b8,local_3e0,(MessageBuilder *)local_368,0);
      local_3e8 = local_368._0_8_ & 0xffffffff;
      if (local_3e8 != 0) {
        uVar6 = 0;
        do {
          VVar4 = ::vk::wsi::getPhysicalDeviceSurfaceSupport
                            (&local_1b8.super_InstanceInterface,local_3e0,(deUint32)uVar6,local_428)
          ;
          local_368._0_8_ = local_3f0;
          std::__cxx11::ostringstream::ostringstream(this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Device ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", queue family ",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,": ",2);
          pcVar7 = "";
          if (VVar4 == 0) {
            pcVar7 = "NOT ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this,pcVar7,(ulong)(VVar4 == 0) << 2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"supported",9);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this);
          std::ios_base::~ios_base(local_2f0);
          if ((wsiType == TYPE_ANDROID) && (VVar4 == 0)) {
            local_368._0_8_ = &local_358;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_368,
                       "Surface must be supported by all devices and queue families","");
            tcu::ResultCollector::fail(&local_3b8,(string *)local_368);
            if ((Vector<unsigned_int,_2> *)local_368._0_8_ != &local_358) {
              operator_delete((void *)local_368._0_8_,(ulong)((long)local_358.m_data + 1));
            }
          }
          uVar6 = uVar6 + 1;
        } while (local_3e8 != uVar6);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)local_440.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_440.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  qVar5 = tcu::ResultCollector::getResult(&local_3b8);
  local_368._0_8_ = &local_358;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_368,local_3b8.m_message._M_dataplus._M_p,
             local_3b8.m_message._M_dataplus._M_p + local_3b8.m_message._M_string_length);
  pTVar3 = local_3f8;
  local_3f8->m_code = qVar5;
  (local_3f8->m_description)._M_dataplus._M_p = (pointer)&(local_3f8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f8->m_description,local_368._0_8_,local_368._8_8_ + local_368._0_8_);
  if ((Vector<unsigned_int,_2> *)local_368._0_8_ != &local_358) {
    operator_delete((void *)local_368._0_8_,(ulong)((long)local_358.m_data + 1));
  }
  pDVar2 = local_400;
  pWVar1 = local_408;
  if (local_440.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_440.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_440.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_440.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((Vector<unsigned_int,_2> *)local_428.m_internal != (Vector<unsigned_int,_2> *)0x0) {
    (**(code **)(*(long *)aStack_420 + 0x68))
              (aStack_420.m_align,local_418,local_428.m_internal,pVStack_410);
  }
  (*pWVar1->_vptr_Window[1])(pWVar1);
  local_3d8.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.
  ptr = (Window *)0x0;
  (**(code **)(*(long *)pDVar2 + 8))(pDVar2);
  ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
  if ((VkInstance)local_1e8._24_8_ != (VkInstance)0x0) {
    (*p_Stack_1c8)((VkInstance)local_1e8._24_8_,local_1c0);
  }
  local_1e8._24_8_ = 0;
  p_Stack_1c8 = (DestroyInstanceFunc)0x0;
  local_1c0 = (VkAllocationCallbacks *)0x0;
  if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ - local_1e8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_message._M_dataplus._M_p != &local_3b8.m_message.field_2) {
    operator_delete(local_3b8.m_message._M_dataplus._M_p,
                    local_3b8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_prefix._M_dataplus._M_p != &local_3b8.m_prefix.field_2) {
    operator_delete(local_3b8.m_prefix._M_dataplus._M_p,
                    local_3b8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus querySurfaceSupportTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log						= context.getTestContext().getLog();
	tcu::ResultCollector			results					(log);

	const InstanceHelper			instHelper				(context, wsiType);
	const NativeObjects				native					(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>		surface					(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const vector<VkPhysicalDevice>	physicalDevices			= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);

	// On Android surface must be supported by all devices and queue families
	const bool						expectSupportedOnAll	= wsiType == TYPE_ANDROID;

	for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
	{
		const VkPhysicalDevice		physicalDevice		= physicalDevices[deviceNdx];
		const deUint32				numQueueFamilies	= getNumQueueFamilies(instHelper.vki, physicalDevice);

		for (deUint32 queueFamilyNdx = 0; queueFamilyNdx < numQueueFamilies; ++queueFamilyNdx)
		{
			const VkBool32	isSupported		= getPhysicalDeviceSurfaceSupport(instHelper.vki, physicalDevice, queueFamilyNdx, *surface);

			log << TestLog::Message << "Device " << deviceNdx << ", queue family " << queueFamilyNdx << ": "
									<< (isSupported == VK_FALSE ? "NOT " : "") << "supported"
				<< TestLog::EndMessage;

			if (expectSupportedOnAll && !isSupported)
				results.fail("Surface must be supported by all devices and queue families");
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}